

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

blob_t blobResize(blob_t blob,size_t size)

{
  ulong *buf;
  void *in_RSI;
  long in_RDI;
  size_t *ptr;
  size_t old_size;
  size_t in_stack_ffffffffffffffd8;
  void *buf_00;
  ulong *local_8;
  
  if (in_RDI == 0) {
    local_8 = (ulong *)blobCreate(in_stack_ffffffffffffffd8);
  }
  else if (in_RSI == (void *)0x0) {
    blobClose((blob_t)0x11609c);
    local_8 = (ulong *)0x0;
  }
  else {
    buf_00 = *(void **)(in_RDI + -8);
    buf = (ulong *)(in_RDI + -8);
    if (((*(long *)(in_RDI + -8) + 0x407U & 0xfffffffffffffc00) ==
         ((long)in_RSI + 0x407U & 0xfffffffffffffc00)) ||
       (buf = (ulong *)memRealloc(buf,0x11612a), buf != (ulong *)0x0)) {
      *buf = (ulong)in_RSI;
      local_8 = buf + 1;
      if (buf_00 < in_RSI) {
        memSet(buf_00,(octet)((ulong)buf >> 0x38),0x116182);
      }
    }
    else {
      local_8 = (ulong *)0x0;
    }
  }
  return local_8;
}

Assistant:

blob_t blobResize(blob_t blob, size_t size)
{
	size_t old_size;
	size_t* ptr;
	// pre
	ASSERT(blobIsValid(blob));
	// создать блоб
	if (blob == 0)
		return blobCreate(size);
	// освободить блоб
	if (size == 0)
	{
		blobClose(blob);
		return 0;
	}
	// сохранить размер
	old_size = blobSizeOf(blob);
	// перераспределить память?
	ptr = blobPtrOf(blob);
	if (blobActualSizeOf(blob) != blobActualSize(size))
	{
		ptr = (size_t*)memRealloc(ptr, blobActualSize(size));
		if (ptr == 0)
			return 0;
	}
	// настроить и возвратить блоб
	*ptr = size;
	blob = blobValueOf(ptr);
	if (size > old_size)
		memSetZero((octet*)blob + old_size, size - old_size);
	return blob;
}